

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_asm(CPState *cp,CPDecl *decl)

{
  CPToken CVar1;
  CPState *in_RSI;
  long in_RDI;
  GCstr *str;
  char *in_stack_ffffffffffffffe8;
  
  cp_next((CPState *)0x17c948);
  cp_check(in_RSI,(CPToken)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (*(int *)(in_RDI + 4) == 0x101) {
    in_stack_ffffffffffffffe8 = *(char **)(in_RDI + 0x10);
    while( true ) {
      CVar1 = cp_next((CPState *)0x17c980);
      if (CVar1 != 0x101) break;
      lj_strfmt_pushf(*(lua_State **)(in_RDI + 0x38),"%s%s",in_stack_ffffffffffffffe8 + 0x10,
                      *(long *)(in_RDI + 0x10) + 0x10);
      *(long *)(*(long *)(in_RDI + 0x38) + 0x18) = *(long *)(*(long *)(in_RDI + 0x38) + 0x18) + -8;
      in_stack_ffffffffffffffe8 = (char *)(ulong)**(uint **)(*(long *)(in_RDI + 0x38) + 0x18);
    }
    in_RSI->p = in_stack_ffffffffffffffe8;
  }
  cp_check(in_RSI,(CPToken)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  return;
}

Assistant:

static void cp_decl_asm(CPState *cp, CPDecl *decl)
{
  UNUSED(decl);
  cp_next(cp);
  cp_check(cp, '(');
  if (cp->tok == CTOK_STRING) {
    GCstr *str = cp->str;
    while (cp_next(cp) == CTOK_STRING) {
      lj_strfmt_pushf(cp->L, "%s%s", strdata(str), strdata(cp->str));
      cp->L->top--;
      str = strV(cp->L->top);
    }
    decl->redir = str;
  }
  cp_check(cp, ')');
}